

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t * archive_acl_to_text_w(archive_acl *acl,ssize_t *text_len,wchar_t flags,archive *a)

{
  archive_acl *__s;
  int *piVar1;
  wchar_t *ws;
  wchar_t *wp;
  wchar_t local_70;
  wchar_t want_type;
  wchar_t r;
  wchar_t id;
  archive_acl_entry *ap;
  int *piStack_58;
  wchar_t separator;
  wchar_t *prefix;
  wchar_t *wname;
  size_t len;
  ssize_t length;
  archive *paStack_30;
  wchar_t count;
  archive *a_local;
  size_t *psStack_20;
  wchar_t flags_local;
  ssize_t *text_len_local;
  archive_acl *acl_local;
  
  paStack_30 = a;
  a_local._4_4_ = flags;
  psStack_20 = (size_t *)text_len;
  text_len_local = (ssize_t *)acl;
  wp._4_4_ = archive_acl_text_want_type(acl,flags);
  if (wp._4_4_ == L'\0') {
    acl_local = (archive_acl *)0x0;
  }
  else {
    if (wp._4_4_ == L'̀') {
      a_local._4_4_ = a_local._4_4_ | 2;
    }
    len = archive_acl_text_len
                    ((archive_acl *)text_len_local,wp._4_4_,a_local._4_4_,L'\x01',paStack_30,
                     (archive_string_conv *)0x0);
    if (len == 0) {
      acl_local = (archive_acl *)0x0;
    }
    else {
      if ((a_local._4_4_ & 8U) == 0) {
        ap._4_4_ = L'\n';
      }
      else {
        ap._4_4_ = L',';
      }
      __s = (archive_acl *)malloc(len << 2);
      ws = (wchar_t *)__s;
      if (__s == (archive_acl *)0x0) {
        piVar1 = __errno_location();
        if (*piVar1 == 0xc) {
          __archive_errx(1,"No memory");
        }
        acl_local = (archive_acl *)0x0;
      }
      else {
        length._4_4_ = 0;
        if ((wp._4_4_ & 0x100U) != 0) {
          append_entry_w(&ws,(wchar_t *)0x0,L'Ā',L'✒',a_local._4_4_,(wchar_t *)0x0,
                         (uint)*text_len_local & 0x1c0,L'\xffffffff');
          *ws = ap._4_4_;
          ws = ws + 1;
          append_entry_w(&ws,(wchar_t *)0x0,L'Ā',L'✔',a_local._4_4_,(wchar_t *)0x0,
                         (uint)*text_len_local & 0x38,L'\xffffffff');
          *ws = ap._4_4_;
          ws = ws + 1;
          append_entry_w(&ws,(wchar_t *)0x0,L'Ā',L'✖',a_local._4_4_,(wchar_t *)0x0,
                         (uint)*text_len_local & 7,L'\xffffffff');
          length._4_4_ = length._4_4_ + 3;
        }
        for (_r = (undefined8 *)text_len_local[1]; _r != (undefined8 *)0x0; _r = (undefined8 *)*_r)
        {
          if (((*(uint *)(_r + 1) & wp._4_4_) != 0) &&
             ((*(int *)(_r + 1) != 0x100 ||
              (((*(int *)((long)_r + 0xc) != 0x2712 && (*(int *)((long)_r + 0xc) != 0x2714)) &&
               (*(int *)((long)_r + 0xc) != 0x2716)))))) {
            if ((*(int *)(_r + 1) == 0x200) && ((a_local._4_4_ & 2U) != 0)) {
              piStack_58 = anon_var_dwarf_958e18;
            }
            else {
              piStack_58 = (wchar_t *)0x0;
            }
            local_70 = archive_mstring_get_wcs(paStack_30,(archive_mstring *)(_r + 3),&prefix);
            if (local_70 == L'\0') {
              if (0 < length._4_4_) {
                *ws = ap._4_4_;
                ws = ws + 1;
              }
              if ((a_local._4_4_ & 1U) == 0) {
                want_type = L'\xffffffff';
              }
              else {
                want_type = *(wchar_t *)((long)_r + 0x14);
              }
              append_entry_w(&ws,piStack_58,*(wchar_t *)(_r + 1),*(wchar_t *)((long)_r + 0xc),
                             a_local._4_4_,prefix,*(wchar_t *)(_r + 2),want_type);
              length._4_4_ = length._4_4_ + 1;
            }
            else if ((local_70 < L'\0') && (piVar1 = __errno_location(), *piVar1 == 0xc)) {
              return (wchar_t *)0x0;
            }
          }
        }
        *ws = L'\0';
        ws = ws + 1;
        wname = (wchar_t *)wcslen((wchar_t *)__s);
        if ((long)(len - 1) < (long)wname) {
          __archive_errx(1,"Buffer overrun");
        }
        acl_local = __s;
        if (psStack_20 != (size_t *)0x0) {
          *psStack_20 = (size_t)wname;
        }
      }
    }
  }
  return (wchar_t *)acl_local;
}

Assistant:

wchar_t *
archive_acl_to_text_w(struct archive_acl *acl, ssize_t *text_len, int flags,
    struct archive *a)
{
	int count;
	ssize_t length;
	size_t len;
	const wchar_t *wname;
	const wchar_t *prefix;
	wchar_t separator;
	struct archive_acl_entry *ap;
	int id, r, want_type;
	wchar_t *wp, *ws;

	want_type = archive_acl_text_want_type(acl, flags);

	/* Both NFSv4 and POSIX.1 types found */
	if (want_type == 0)
		return (NULL);

	if (want_type == ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)
		flags |= ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT;

	length = archive_acl_text_len(acl, want_type, flags, 1, a, NULL);

	if (length == 0)
		return (NULL);

	if (flags & ARCHIVE_ENTRY_ACL_STYLE_SEPARATOR_COMMA)
		separator = L',';
	else
		separator = L'\n';

	/* Now, allocate the string and actually populate it. */
	wp = ws = (wchar_t *)malloc(length * sizeof(wchar_t));
	if (wp == NULL) {
		if (errno == ENOMEM)
			__archive_errx(1, "No memory");
		return (NULL);
	}
	count = 0;

	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_USER_OBJ, flags, NULL,
		    acl->mode & 0700, -1);
		*wp++ = separator;
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_GROUP_OBJ, flags, NULL,
		    acl->mode & 0070, -1);
		*wp++ = separator;
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_OTHER, flags, NULL,
		    acl->mode & 0007, -1);
		count += 3;
	}

	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		if (ap->type == ARCHIVE_ENTRY_ACL_TYPE_DEFAULT &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) != 0)
			prefix = L"default:";
		else
			prefix = NULL;
		r = archive_mstring_get_wcs(a, &ap->name, &wname);
		if (r == 0) {
			if (count > 0)
				*wp++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry_w(&wp, prefix, ap->type, ap->tag, flags,
			    wname, ap->permset, id);
			count++;
		} else if (r < 0 && errno == ENOMEM)
			return (NULL);
	}

	/* Add terminating character */
	*wp++ = L'\0';

	len = wcslen(ws);

	if ((ssize_t)len > (length - 1))
		__archive_errx(1, "Buffer overrun");

	if (text_len != NULL)
		*text_len = len;

	return (ws);
}